

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternBuilder.cpp
# Opt level: O3

void __thiscall
PatternBuilder::PatternBuilder(PatternBuilder *this,HammeringPattern *hammering_pattern)

{
  uint uVar1;
  long lVar2;
  size_t __i;
  ulong uVar3;
  undefined1 local_2728 [8];
  random_device rd;
  
  this->pattern = hammering_pattern;
  (this->gen)._M_x[0] = 0x1571;
  uVar3 = 0x1571;
  lVar2 = 2;
  do {
    uVar3 = (ulong)((((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2) - 1);
    (this->gen)._M_x[lVar2 + -1] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x271);
  (this->gen)._M_p = 0x270;
  this->aggressor_id_counter = 1;
  std::random_device::random_device((random_device *)local_2728);
  uVar1 = std::random_device::_M_getval();
  rd.field_0._M_mt._M_p = (size_t)uVar1;
  lVar2 = 1;
  uVar3 = rd.field_0._M_mt._M_p;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    *(ulong *)((long)&rd.field_0 + lVar2 * 8 + 0x1380) = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  memcpy(&this->gen,(void *)((long)&rd.field_0 + 0x1380),5000);
  std::random_device::_M_fini();
  return;
}

Assistant:

PatternBuilder::PatternBuilder(HammeringPattern &hammering_pattern)
    : pattern(hammering_pattern), aggressor_id_counter(1) {
  std::random_device rd;
  gen = std::mt19937(rd());
}